

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O2

Var __thiscall
Js::DiagStackFrame::GetThisFromFrame
          (DiagStackFrame *this,IDiagObjectAddress **ppOutAddress,
          IDiagObjectModelWalkerBase *localsWalker)

{
  bool bVar1;
  int iVar2;
  BOOL BVar3;
  ModuleID moduleID;
  undefined4 extraout_var;
  JavascriptFunction *this_00;
  FunctionBody *this_01;
  ParseableFunctionInfo *this_02;
  ReferencedArenaAdapter *pRVar4;
  IDiagObjectAddress *pIVar5;
  undefined4 extraout_var_02;
  GlobalObject *this_03;
  ArenaAllocator *alloc;
  ModuleRoot *local_40;
  Var varThis;
  bool unused;
  ScriptContext *scriptContext;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar2 = (*this->_vptr_DiagStackFrame[10])();
  scriptContext = (ScriptContext *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*this->_vptr_DiagStackFrame[2])(this);
  this_00 = (JavascriptFunction *)CONCAT44(extraout_var_00,iVar2);
  BVar3 = JavascriptFunction::IsScriptFunction(this_00);
  if (BVar3 == 0) {
    moduleID = 0;
  }
  else {
    this_01 = JavascriptFunction::GetFunctionBody(this_00);
    moduleID = FunctionBody::GetModuleID(this_01);
  }
  local_40 = (ModuleRoot *)
             (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).nullValue.ptr;
  BVar3 = JavascriptFunction::IsLambda(this_00);
  if (BVar3 == 0) {
    JavascriptStackWalker::GetThis(&local_40,moduleID,this_00,scriptContext);
  }
  else {
    this_02 = JavascriptFunction::GetParseableFunctionInfo(this_00);
    bVar1 = FunctionProxy::GetCapturesThis(&this_02->super_FunctionProxy);
    if (!bVar1) {
      return (Var)0x0;
    }
    if (localsWalker == (IDiagObjectModelWalkerBase *)0x0) {
      pRVar4 = DebugManager::GetDiagnosticArena(scriptContext->threadContext->debugManager);
      alloc = (ArenaAllocator *)0x0;
      if (pRVar4->deleteFlag == false) {
        alloc = pRVar4->arena;
      }
      localsWalker = (IDiagObjectModelWalkerBase *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
      LocalsWalker::LocalsWalker((LocalsWalker *)localsWalker,this,6);
    }
    varThis._7_1_ = 0;
    iVar2 = (*(((LocalsWalker *)localsWalker)->super_IDiagObjectModelWalkerBase).
              _vptr_IDiagObjectModelWalkerBase[3])(localsWalker,0x2d5);
    pIVar5 = (IDiagObjectAddress *)CONCAT44(extraout_var_01,iVar2);
    if (ppOutAddress != (IDiagObjectAddress **)0x0) {
      *ppOutAddress = pIVar5;
    }
    if (pIVar5 == (IDiagObjectAddress *)0x0) {
      if (moduleID == 0) {
        this_03 = JavascriptOperators::OP_LdRoot(scriptContext);
        local_40 = (ModuleRoot *)GlobalObject::ToThis(this_03);
      }
      else {
        local_40 = JavascriptOperators::GetModuleRoot(moduleID,scriptContext);
      }
    }
    else {
      iVar2 = (*pIVar5->_vptr_IDiagObjectAddress[2])(pIVar5,0);
      local_40 = (ModuleRoot *)CONCAT44(extraout_var_02,iVar2);
    }
  }
  BVar3 = IsStrictMode(this);
  if (BVar3 == 0) {
    GlobalObject::UpdateThisForEval(&local_40,moduleID,scriptContext);
  }
  return local_40;
}

Assistant:

Js::Var DiagStackFrame::GetThisFromFrame(Js::IDiagObjectAddress ** ppOutAddress, Js::IDiagObjectModelWalkerBase * localsWalker)
    {
        Js::ScriptContext* scriptContext = this->GetScriptContext();
        Js::JavascriptFunction* scopeFunction = this->GetJavascriptFunction();
        Js::ModuleID moduleId = scopeFunction->IsScriptFunction() ? scopeFunction->GetFunctionBody()->GetModuleID() : 0;
        Js::Var varThis = scriptContext->GetLibrary()->GetNull();

        if (!scopeFunction->IsLambda())
        {
            Js::JavascriptStackWalker::GetThis(&varThis, moduleId, scopeFunction, scriptContext);
        }
        else
        {
            if (!scopeFunction->GetParseableFunctionInfo()->GetCapturesThis())
            {
                return nullptr;
            }
            else
            {
                // Emulate Js::JavascriptOperators::OP_GetThisScoped using a locals walker and assigning moduleId object if not found by locals walker
                if (localsWalker == nullptr)
                {
                    ArenaAllocator *arena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena()->Arena();
                    localsWalker = Anew(arena, Js::LocalsWalker, this, Js::FrameWalkerFlags::FW_EnumWithScopeAlso | Js::FrameWalkerFlags::FW_AllowLexicalThis);
                }

                bool unused = false;
                Js::IDiagObjectAddress* address = localsWalker->FindPropertyAddress(Js::PropertyIds::_this, unused);

                if (ppOutAddress != nullptr)
                {
                    *ppOutAddress = address;
                }

                if (address != nullptr)
                {
                    varThis = address->GetValue(FALSE);
                }
                else if (moduleId == kmodGlobal)
                {
                    varThis = Js::JavascriptOperators::OP_LdRoot(scriptContext)->ToThis();
                }
                else
                {
                    varThis = (Var)Js::JavascriptOperators::GetModuleRoot(moduleId, scriptContext);
                }
            }
        }

        if (!this->IsStrictMode())
        {
            Js::GlobalObject::UpdateThisForEval(varThis, moduleId, scriptContext);
        }
        return varThis;
    }